

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O3

void __thiscall
QProcess::start(QProcess *this,QString *program,QStringList *arguments,OpenMode mode)

{
  QProcessPrivate *this_00;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QProcessPrivate *)(this->super_QIODevice).super_QObject.d_ptr.d;
  if (this_00->processState == '\0') {
    if ((program->d).size != 0) {
      QString::operator=(&this_00->program,program);
      QArrayDataPointer<QString>::operator=(&(this_00->arguments).d,&arguments->d);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QProcessPrivate::start(this_00,mode);
        return;
      }
      goto LAB_0041d637;
    }
    QMetaObject::tr(&local_38,&staticMetaObject,"No program defined",(char *)0x0,-1);
    QProcessPrivate::setErrorAndEmit(this_00,FailedToStart,&local_38);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    start();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_0041d637:
  __stack_chk_fail();
}

Assistant:

void QProcess::start(const QString &program, const QStringList &arguments, OpenMode mode)
{
    Q_D(QProcess);
    if (d->processState != NotRunning) {
        qWarning("QProcess::start: Process is already running");
        return;
    }
    if (program.isEmpty()) {
        d->setErrorAndEmit(QProcess::FailedToStart, tr("No program defined"));
        return;
    }

    d->program = program;
    d->arguments = arguments;

    d->start(mode);
}